

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::LayerNorm_x86_avx::forward_inplace(LayerNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  uint uVar6;
  _func_int **pp_Var7;
  _func_int *p_Var8;
  float *pfVar9;
  float *pfVar10;
  void *pvVar11;
  size_t sVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  bool bVar17;
  float fVar18;
  bool bVar19;
  long lVar20;
  float *pfVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  float *pfVar26;
  ulong uVar27;
  int q;
  int iVar28;
  long lVar29;
  int iVar30;
  float *pfVar31;
  undefined1 (*pauVar32) [32];
  undefined1 (*pauVar33) [32];
  int i;
  float *pfVar34;
  ulong uVar35;
  float fVar36;
  undefined1 auVar37 [16];
  float _mean;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar51;
  __m128 _low;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  float fVar52;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  float fVar53;
  undefined1 auVar50 [64];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  __m128 _high;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [16];
  float fVar100;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  float fVar113;
  float fVar114;
  __m128 _a_128;
  undefined1 auVar104 [28];
  undefined1 auVar102 [16];
  undefined1 auVar105 [28];
  undefined1 auVar106 [28];
  undefined1 auVar101 [16];
  undefined1 auVar107 [32];
  float fVar115;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar103 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar91 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  
  iVar5 = bottom_top_blob->elempack;
  iVar28 = bottom_top_blob->dims;
  iVar30 = bottom_top_blob->w;
  pp_Var7 = this->_vptr_LayerNorm_x86_avx;
  p_Var8 = pp_Var7[-3];
  pfVar9 = *(float **)(&this->field_0xe0 + (long)p_Var8);
  pfVar10 = *(float **)(&this->field_0x128 + (long)p_Var8);
  if (iVar28 == 1) {
    iVar30 = iVar30 * iVar5;
    pvVar11 = bottom_top_blob->data;
    auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
    for (lVar20 = 0; (int)lVar20 + 8 <= iVar30; lVar20 = lVar20 + 8) {
      pfVar21 = (float *)((long)pvVar11 + lVar20 * 4);
      auVar50 = ZEXT3264(CONCAT428(auVar50._28_4_ + pfVar21[7],
                                   CONCAT424(auVar50._24_4_ + pfVar21[6],
                                             CONCAT420(auVar50._20_4_ + pfVar21[5],
                                                       CONCAT416(auVar50._16_4_ + pfVar21[4],
                                                                 CONCAT412(auVar50._12_4_ +
                                                                           pfVar21[3],
                                                                           CONCAT48(auVar50._8_4_ +
                                                                                    pfVar21[2],
                                                                                    CONCAT44(auVar50
                                                  ._4_4_ + pfVar21[1],auVar50._0_4_ + *pfVar21))))))
                                  ));
    }
    auVar39 = ZEXT816(0) << 0x40;
    while( true ) {
      fVar36 = auVar39._4_4_;
      fVar41 = auVar39._8_4_;
      auVar93._0_4_ = auVar39._12_4_;
      if (iVar30 < (int)lVar20 + 4) break;
      pfVar21 = (float *)((long)pvVar11 + lVar20 * 4);
      auVar39._0_4_ = auVar39._0_4_ + *pfVar21;
      auVar39._4_4_ = fVar36 + pfVar21[1];
      auVar39._8_4_ = fVar41 + pfVar21[2];
      auVar39._12_4_ = auVar93._0_4_ + pfVar21[3];
      lVar20 = lVar20 + 4;
    }
    fVar51 = 0.0;
    for (; (int)lVar20 < iVar30; lVar20 = lVar20 + 1) {
      fVar51 = fVar51 + *(float *)((long)pvVar11 + lVar20 * 4);
    }
    auVar38 = vhaddps_avx(auVar50._16_16_,auVar50._0_16_);
    auVar37 = vshufpd_avx(auVar39,auVar39,1);
    auVar38 = vhaddps_avx(auVar38,auVar38);
    auVar40._0_4_ = auVar37._0_4_ + auVar39._0_4_;
    auVar40._4_4_ = auVar37._4_4_ + fVar36;
    auVar40._8_4_ = auVar37._8_4_ + fVar41;
    auVar40._12_4_ = auVar37._12_4_ + auVar93._0_4_;
    auVar39 = vhaddps_avx(auVar38,auVar38);
    auVar93 = vmovshdup_avx(auVar40);
    auVar38._0_4_ = (auVar39._0_4_ + auVar93._0_4_ + auVar40._0_4_ + fVar51) / (float)iVar30;
    auVar38._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar39 = vshufps_avx(auVar38,auVar38,0);
    auVar70._16_16_ = auVar39;
    auVar70._0_16_ = auVar39;
    auVar50 = ZEXT864(0) << 0x20;
    for (lVar20 = 0; (int)lVar20 + 8 <= iVar30; lVar20 = lVar20 + 8) {
      auVar73 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar11 + lVar20 * 4),auVar70);
      auVar50 = ZEXT3264(CONCAT428(auVar73._28_4_ + auVar50._28_4_,
                                   CONCAT424(auVar73._24_4_ * auVar73._24_4_ + auVar50._24_4_,
                                             CONCAT420(auVar73._20_4_ * auVar73._20_4_ +
                                                       auVar50._20_4_,
                                                       CONCAT416(auVar73._16_4_ * auVar73._16_4_ +
                                                                 auVar50._16_4_,
                                                                 CONCAT412(auVar73._12_4_ *
                                                                           auVar73._12_4_ +
                                                                           auVar50._12_4_,
                                                                           CONCAT48(auVar73._8_4_ *
                                                                                    auVar73._8_4_ +
                                                                                    auVar50._8_4_,
                                                                                    CONCAT44(auVar73
                                                  ._4_4_ * auVar73._4_4_ + auVar50._4_4_,
                                                  auVar73._0_4_ * auVar73._0_4_ + auVar50._0_4_)))))
                                            )));
    }
    auVar39 = vshufps_avx(auVar38,auVar38,0);
    auVar37 = ZEXT816(0) << 0x20;
    while( true ) {
      fVar36 = auVar37._4_4_;
      fVar41 = auVar37._8_4_;
      auVar93._0_4_ = auVar37._12_4_;
      if (iVar30 < (int)lVar20 + 4) break;
      auVar40 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar11 + lVar20 * 4),auVar39);
      auVar37._0_4_ = auVar40._0_4_ * auVar40._0_4_ + auVar37._0_4_;
      auVar37._4_4_ = auVar40._4_4_ * auVar40._4_4_ + fVar36;
      auVar37._8_4_ = auVar40._8_4_ * auVar40._8_4_ + fVar41;
      auVar37._12_4_ = auVar40._12_4_ * auVar40._12_4_ + auVar93._0_4_;
      lVar20 = lVar20 + 4;
    }
    fVar51 = 0.0;
    for (; (int)lVar20 < iVar30; lVar20 = lVar20 + 1) {
      fVar52 = *(float *)((long)pvVar11 + lVar20 * 4) - auVar38._0_4_;
      fVar51 = fVar52 * fVar52 + fVar51;
    }
    auVar39 = vhaddps_avx(auVar50._16_16_,auVar50._0_16_);
    auVar39 = vhaddps_avx(auVar39,auVar39);
    auVar40 = vshufpd_avx(auVar37,auVar37,1);
    auVar39 = vhaddps_avx(auVar39,auVar39);
    auVar63._0_4_ = auVar40._0_4_ + auVar37._0_4_;
    auVar63._4_4_ = auVar40._4_4_ + fVar36;
    auVar63._8_4_ = auVar40._8_4_ + fVar41;
    auVar63._12_4_ = auVar40._12_4_ + auVar93._0_4_;
    auVar50 = ZEXT1664(auVar63);
    auVar93 = vmovshdup_avx(auVar63);
    fVar36 = (auVar39._0_4_ + auVar93._0_4_ + auVar63._0_4_ + fVar51) / (float)iVar30 +
             *(float *)(&this->field_0xd4 + (long)p_Var8);
    auVar39 = vrsqrtss_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
    fVar41 = auVar39._0_4_;
    fVar52 = fVar41 * -0.5 * (fVar36 * fVar41 * fVar41 + -3.0);
    fVar100 = fVar52 * -auVar38._0_4_;
    auVar37 = ZEXT416((uint)fVar52);
    auVar39 = vshufps_avx(auVar37,auVar37,0);
    auVar38 = vshufps_avx(ZEXT416((uint)fVar100),ZEXT416((uint)fVar100),0);
    auVar40 = ZEXT416((uint)fVar100);
    fVar113 = auVar39._0_4_;
    fVar114 = auVar39._4_4_;
    fVar115 = auVar39._8_4_;
    fVar36 = auVar38._0_4_;
    fVar41 = auVar38._4_4_;
    auVar93._0_4_ = auVar38._8_4_;
    fVar51 = auVar38._12_4_;
    if (*(int *)(&this->field_0xd8 + (long)p_Var8) == 0) {
      for (lVar20 = 0; (int)lVar20 + 8 <= iVar30; lVar20 = lVar20 + 8) {
        pfVar9 = (float *)((long)pvVar11 + lVar20 * 4);
        auVar73._0_4_ = fVar113 * *pfVar9 + fVar36;
        auVar73._4_4_ = fVar114 * pfVar9[1] + fVar41;
        auVar73._8_4_ = fVar115 * pfVar9[2] + auVar93._0_4_;
        auVar73._12_4_ = auVar39._12_4_ * pfVar9[3] + fVar51;
        auVar73._16_4_ = fVar113 * pfVar9[4] + fVar36;
        auVar73._20_4_ = fVar114 * pfVar9[5] + fVar41;
        auVar73._24_4_ = fVar115 * pfVar9[6] + auVar93._0_4_;
        auVar73._28_4_ = auVar50._28_4_ + fVar51;
        auVar50 = ZEXT3264(auVar73);
        *(undefined1 (*) [32])((long)pvVar11 + lVar20 * 4) = auVar73;
      }
      auVar39 = vshufps_avx(auVar37,auVar37,0);
      auVar38 = vshufps_avx(auVar40,auVar40,0);
      for (; (int)lVar20 + 4 <= iVar30; lVar20 = lVar20 + 4) {
        pfVar9 = (float *)((long)pvVar11 + lVar20 * 4);
        fVar36 = pfVar9[1];
        fVar41 = pfVar9[2];
        auVar93._0_4_ = pfVar9[3];
        pfVar10 = (float *)((long)pvVar11 + lVar20 * 4);
        *pfVar10 = auVar39._0_4_ * *pfVar9 + auVar38._0_4_;
        pfVar10[1] = auVar39._4_4_ * fVar36 + auVar38._4_4_;
        pfVar10[2] = auVar39._8_4_ * fVar41 + auVar38._8_4_;
        pfVar10[3] = auVar39._12_4_ * auVar93._0_4_ + auVar38._12_4_;
      }
      for (; (int)lVar20 < iVar30; lVar20 = lVar20 + 1) {
        *(float *)((long)pvVar11 + lVar20 * 4) =
             fVar52 * *(float *)((long)pvVar11 + lVar20 * 4) + fVar100;
      }
    }
    else {
      for (lVar20 = 0; (int)lVar20 + 8 <= iVar30; lVar20 = lVar20 + 8) {
        pfVar21 = (float *)((long)pvVar11 + lVar20 * 4);
        pfVar34 = pfVar9 + lVar20;
        pfVar26 = pfVar10 + lVar20;
        auVar71._0_4_ = (fVar113 * *pfVar21 + fVar36) * *pfVar34 + *pfVar26;
        auVar71._4_4_ = (fVar114 * pfVar21[1] + fVar41) * pfVar34[1] + pfVar26[1];
        auVar71._8_4_ = (fVar115 * pfVar21[2] + auVar93._0_4_) * pfVar34[2] + pfVar26[2];
        auVar71._12_4_ = (auVar39._12_4_ * pfVar21[3] + fVar51) * pfVar34[3] + pfVar26[3];
        auVar71._16_4_ = (fVar113 * pfVar21[4] + fVar36) * pfVar34[4] + pfVar26[4];
        auVar71._20_4_ = (fVar114 * pfVar21[5] + fVar41) * pfVar34[5] + pfVar26[5];
        auVar71._24_4_ = (fVar115 * pfVar21[6] + auVar93._0_4_) * pfVar34[6] + pfVar26[6];
        auVar71._28_4_ = auVar50._28_4_ + fVar51 + pfVar26[7];
        auVar50 = ZEXT3264(auVar71);
        *(undefined1 (*) [32])((long)pvVar11 + lVar20 * 4) = auVar71;
      }
      auVar39 = vshufps_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52),0);
      auVar38 = vshufps_avx(auVar40,auVar40,0);
      for (; (int)lVar20 + 4 <= iVar30; lVar20 = lVar20 + 4) {
        pfVar21 = (float *)((long)pvVar11 + lVar20 * 4);
        fVar36 = pfVar21[1];
        fVar41 = pfVar21[2];
        auVar93._0_4_ = pfVar21[3];
        pfVar34 = pfVar9 + lVar20;
        fVar51 = pfVar34[1];
        fVar113 = pfVar34[2];
        fVar114 = pfVar34[3];
        pfVar26 = pfVar10 + lVar20;
        fVar115 = pfVar26[1];
        fVar53 = pfVar26[2];
        fVar3 = pfVar26[3];
        pfVar31 = (float *)((long)pvVar11 + lVar20 * 4);
        *pfVar31 = (auVar39._0_4_ * *pfVar21 + auVar38._0_4_) * *pfVar34 + *pfVar26;
        pfVar31[1] = (auVar39._4_4_ * fVar36 + auVar38._4_4_) * fVar51 + fVar115;
        pfVar31[2] = (auVar39._8_4_ * fVar41 + auVar38._8_4_) * fVar113 + fVar53;
        pfVar31[3] = (auVar39._12_4_ * auVar93._0_4_ + auVar38._12_4_) * fVar114 + fVar3;
      }
      for (; (int)lVar20 < iVar30; lVar20 = lVar20 + 1) {
        *(float *)((long)pvVar11 + lVar20 * 4) =
             (fVar52 * *(float *)((long)pvVar11 + lVar20 * 4) + fVar100) * pfVar9[lVar20] +
             pfVar10[lVar20];
      }
    }
  }
  else {
    uVar6 = bottom_top_blob->h;
    if (iVar28 == 3) {
      uVar24 = 0;
      uVar22 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar22 = uVar24;
      }
      if (*(int *)(&this->field_0xd0 + (long)p_Var8) == iVar30) {
        iVar28 = iVar30 * iVar5;
        fVar36 = 1.0 / (float)iVar30;
        auVar39 = vshufps_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),0);
        uVar27 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar27 = uVar24;
        }
        for (; uVar24 != uVar22; uVar24 = uVar24 + 1) {
          pp_Var7 = this->_vptr_LayerNorm_x86_avx;
          for (uVar35 = 0; uVar35 != uVar27; uVar35 = uVar35 + 1) {
            pvVar11 = bottom_top_blob->data;
            sVar12 = bottom_top_blob->elemsize;
            lVar23 = bottom_top_blob->cstep * uVar24;
            lVar29 = (long)bottom_top_blob->w * uVar35;
            pauVar33 = (undefined1 (*) [32])((long)pvVar11 + lVar29 * sVar12 + lVar23 * sVar12);
            fVar41 = *(float *)(&this->field_0xd4 + (long)pp_Var7[-3]);
            lVar20 = 0;
            auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
            pauVar32 = pauVar33;
            iVar30 = 0;
            while( true ) {
              auVar93._0_4_ = auVar50._0_4_;
              fVar51 = auVar50._4_4_;
              fVar52 = auVar50._8_4_;
              fVar100 = auVar50._12_4_;
              fVar113 = auVar50._16_4_;
              fVar114 = auVar50._20_4_;
              fVar115 = auVar50._24_4_;
              if (iVar28 < iVar30 + 8) break;
              auVar50 = ZEXT3264(CONCAT428(auVar50._28_4_ + *(float *)(*pauVar32 + 0x1c),
                                           CONCAT424(fVar115 + *(float *)(*pauVar32 + 0x18),
                                                     CONCAT420(fVar114 + *(float *)(*pauVar32 + 0x14
                                                                                   ),
                                                               CONCAT416(fVar113 + *(float *)(*
                                                  pauVar32 + 0x10),
                                                  CONCAT412(fVar100 + *(float *)(*pauVar32 + 0xc),
                                                            CONCAT48(fVar52 + *(float *)(*pauVar32 +
                                                                                        8),
                                                                     CONCAT44(fVar51 + *(float *)(*
                                                  pauVar32 + 4),auVar93._0_4_ + *(float *)*pauVar32)
                                                  )))))));
              pauVar32 = pauVar32 + 1;
              lVar20 = lVar20 + 8;
              iVar30 = iVar30 + 8;
            }
            auVar59 = ZEXT816(0) << 0x40;
            while( true ) {
              iVar30 = iVar30 + 4;
              fVar54 = auVar59._0_4_;
              fVar53 = auVar59._4_4_;
              fVar3 = auVar59._8_4_;
              fVar4 = auVar59._12_4_;
              if (iVar28 < iVar30) break;
              auVar59._0_4_ = fVar54 + *(float *)*pauVar32;
              auVar59._4_4_ = fVar53 + *(float *)(*pauVar32 + 4);
              auVar59._8_4_ = fVar3 + *(float *)(*pauVar32 + 8);
              auVar59._12_4_ = fVar4 + *(float *)(*pauVar32 + 0xc);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
              lVar20 = lVar20 + 4;
            }
            lVar23 = sVar12 * (lVar23 + lVar29);
            fVar74 = 0.0;
            for (; (int)lVar20 < iVar28; lVar20 = lVar20 + 1) {
              fVar74 = fVar74 + *(float *)((long)pvVar11 + lVar20 * 4 + lVar23);
            }
            fVar13 = auVar39._0_4_;
            fVar14 = auVar39._4_4_;
            fVar15 = auVar39._8_4_;
            fVar16 = auVar39._12_4_;
            if (iVar5 == 8) {
              auVar93._0_4_ = auVar93._0_4_ * fVar13;
              auVar93._4_4_ = fVar51 * fVar14;
              auVar93._8_4_ = fVar52 * fVar15;
              auVar93._12_4_ = fVar100 * fVar16;
              auVar98._16_4_ = fVar113 * fVar13;
              auVar98._0_16_ = auVar93;
              auVar98._20_4_ = fVar114 * fVar14;
              auVar98._28_36_ = in_ZMM12._28_36_;
              auVar98._24_4_ = fVar115 * fVar15;
              auVar69 = auVar98._0_32_;
              in_ZMM12 = ZEXT3264(auVar69);
              auVar102 = vshufps_avx(auVar93,auVar93,0);
              bVar17 = true;
              bVar25 = false;
              bVar19 = false;
            }
            else {
              if (iVar5 == 4) {
                auVar102._0_4_ = (fVar113 + auVar93._0_4_ + fVar54) * fVar13;
                auVar102._4_4_ = (fVar114 + fVar51 + fVar53) * fVar14;
                auVar102._8_4_ = (fVar115 + fVar52 + fVar3) * fVar15;
                auVar102._12_4_ = (auVar50._28_4_ + fVar100 + fVar4) * fVar16;
                bVar19 = true;
                bVar25 = false;
                auVar92 = auVar102;
                auVar93._0_4_ = auVar102._0_4_;
              }
              else {
                if (iVar5 != 1) {
                  auVar93._0_4_ = 0.0;
                  auVar92 = ZEXT816(0) << 0x40;
                  auVar102 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar38 = vshufpd_avx(auVar59,auVar59,1);
                  auVar93 = vhaddps_avx(auVar50._16_16_,auVar50._0_16_);
                  auVar60._0_4_ = auVar38._0_4_ + fVar54;
                  auVar60._4_4_ = auVar38._4_4_ + fVar53;
                  auVar60._8_4_ = auVar38._8_4_ + fVar3;
                  auVar60._12_4_ = auVar38._12_4_ + fVar4;
                  auVar93 = vhaddps_avx(auVar93,auVar93);
                  auVar38 = vmovshdup_avx(auVar60);
                  auVar93 = vhaddps_avx(auVar93,auVar93);
                  auVar93._0_4_ = (auVar93._0_4_ + auVar38._0_4_ + auVar60._0_4_ + fVar74) * fVar36;
                  auVar92._4_8_ = SUB128(ZEXT812(0),4);
                  auVar92._0_4_ = auVar93._0_4_;
                  auVar92._12_4_ = 0;
                  auVar102 = vshufps_avx(ZEXT416((uint)auVar93._0_4_),ZEXT416((uint)auVar93._0_4_),0
                                        );
                }
                bVar25 = iVar5 == 1;
                bVar19 = false;
              }
              in_ZMM12 = ZEXT1664(auVar92);
              auVar69._16_16_ = auVar102;
              auVar69._0_16_ = auVar102;
              bVar17 = false;
            }
            lVar20 = 0;
            auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
            pauVar32 = pauVar33;
            iVar30 = 0;
            while( true ) {
              fVar51 = auVar50._0_4_;
              fVar52 = auVar50._4_4_;
              fVar100 = auVar50._8_4_;
              fVar113 = auVar50._12_4_;
              fVar114 = auVar50._16_4_;
              fVar115 = auVar50._20_4_;
              fVar53 = auVar50._24_4_;
              if (iVar28 < iVar30 + 8) break;
              auVar70 = vsubps_avx(*pauVar32,auVar69);
              auVar50 = ZEXT3264(CONCAT428(auVar70._28_4_ + auVar50._28_4_,
                                           CONCAT424(auVar70._24_4_ * auVar70._24_4_ + fVar53,
                                                     CONCAT420(auVar70._20_4_ * auVar70._20_4_ +
                                                               fVar115,CONCAT416(auVar70._16_4_ *
                                                                                 auVar70._16_4_ +
                                                                                 fVar114,CONCAT412(
                                                  auVar70._12_4_ * auVar70._12_4_ + fVar113,
                                                  CONCAT48(auVar70._8_4_ * auVar70._8_4_ + fVar100,
                                                           CONCAT44(auVar70._4_4_ * auVar70._4_4_ +
                                                                    fVar52,auVar70._0_4_ *
                                                                           auVar70._0_4_ + fVar51)))
                                                  )))));
              pauVar32 = pauVar32 + 1;
              lVar20 = lVar20 + 8;
              iVar30 = iVar30 + 8;
            }
            auVar61 = ZEXT816(0) << 0x20;
            while( true ) {
              iVar30 = iVar30 + 4;
              fVar3 = auVar61._4_4_;
              fVar4 = auVar61._8_4_;
              fVar54 = auVar61._12_4_;
              if (iVar28 < iVar30) break;
              auVar38 = vsubps_avx(*(undefined1 (*) [16])*pauVar32,auVar102);
              auVar61._0_4_ = auVar38._0_4_ * auVar38._0_4_ + auVar61._0_4_;
              auVar61._4_4_ = auVar38._4_4_ * auVar38._4_4_ + fVar3;
              auVar61._8_4_ = auVar38._8_4_ * auVar38._8_4_ + fVar4;
              auVar61._12_4_ = auVar38._12_4_ * auVar38._12_4_ + fVar54;
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
              lVar20 = lVar20 + 4;
            }
            auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
            for (; (int)lVar20 < iVar28; lVar20 = lVar20 + 1) {
              fVar74 = *(float *)((long)pvVar11 + lVar20 * 4 + lVar23) - auVar93._0_4_;
              auVar81 = ZEXT464((uint)(fVar74 * fVar74 + auVar81._0_4_));
            }
            if (bVar17) {
              auVar109._0_4_ = fVar51 * fVar13;
              auVar109._4_4_ = fVar52 * fVar14;
              auVar109._8_4_ = fVar100 * fVar15;
              auVar109._12_4_ = fVar113 * fVar16;
              auVar109._16_4_ = fVar114 * fVar13;
              auVar109._20_4_ = fVar115 * fVar14;
              auVar109._24_4_ = fVar53 * fVar15;
              auVar109._28_4_ = 0;
            }
            else {
              auVar109 = ZEXT1232(ZEXT812(0)) << 0x20;
            }
            auVar38 = auVar50._16_16_;
            if (bVar19) {
              auVar61._0_4_ = fVar114 + fVar51 + auVar61._0_4_;
              auVar61._4_4_ = fVar115 + fVar52 + fVar3;
              auVar61._8_4_ = fVar53 + fVar100 + fVar4;
              auVar61._12_4_ = auVar50._28_4_ + fVar113 + fVar54;
              auVar109 = vblendps_avx(auVar109,ZEXT1632(CONCAT412(auVar61._12_4_ * fVar16,
                                                                  CONCAT48(auVar61._8_4_ * fVar15,
                                                                           CONCAT44(auVar61._4_4_ *
                                                                                    fVar14,auVar61.
                                                  _0_4_ * fVar13)))),0xf);
            }
            if (bVar25) {
              auVar37 = vshufpd_avx(auVar61,auVar61,1);
              auVar62._0_4_ = auVar37._0_4_ + auVar61._0_4_;
              auVar62._4_4_ = auVar37._4_4_ + auVar61._4_4_;
              auVar62._8_4_ = auVar37._8_4_ + auVar61._8_4_;
              auVar62._12_4_ = auVar37._12_4_ + auVar61._12_4_;
              auVar37 = vhaddps_avx(auVar38,auVar50._0_16_);
              auVar38 = vmovshdup_avx(auVar62);
              auVar37 = vhaddps_avx(auVar37,auVar37);
              auVar37 = vhaddps_avx(auVar37,auVar37);
              auVar109 = vblendps_avx(auVar109,ZEXT432((uint)((auVar37._0_4_ +
                                                              auVar81._0_4_ + auVar38._0_4_ +
                                                              auVar62._0_4_) * fVar36)),1);
            }
            auVar105 = auVar109._0_28_;
            auVar50 = ZEXT1664(auVar38);
            fVar51 = auVar109._0_4_;
            if (iVar5 == 1) {
              fVar51 = fVar51 + fVar41;
              auVar38 = vrsqrtss_avx(ZEXT416((uint)fVar51),ZEXT416((uint)fVar51));
              fVar41 = auVar38._0_4_;
              fVar41 = fVar41 * -0.5 * (fVar51 * fVar41 * fVar41 + -3.0);
              auVar70 = vblendps_avx(auVar109,ZEXT432((uint)fVar41),1);
              auVar105 = auVar70._0_28_;
              auVar70 = vblendps_avx(in_ZMM12._0_32_,ZEXT432((uint)(fVar41 * -auVar93._0_4_)),1);
              in_ZMM12 = ZEXT3264(auVar70);
            }
            else if (iVar5 == 4) {
              auVar93 = vshufps_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),0);
              auVar43._0_4_ = fVar51 + auVar93._0_4_;
              auVar43._4_4_ = auVar109._4_4_ + auVar93._4_4_;
              auVar43._8_4_ = auVar109._8_4_ + auVar93._8_4_;
              auVar43._12_4_ = auVar109._12_4_ + auVar93._12_4_;
              auVar38 = vrsqrtps_avx(auVar43);
              fVar41 = auVar38._0_4_;
              auVar93._0_4_ = auVar38._4_4_;
              fVar51 = auVar38._8_4_;
              fVar52 = auVar38._12_4_;
              fVar41 = fVar41 * -0.5 * (auVar43._0_4_ * fVar41 * fVar41 + -3.0);
              auVar93._0_4_ =
                   auVar93._0_4_ * -0.5 * (auVar43._4_4_ * auVar93._0_4_ * auVar93._0_4_ + -3.0);
              fVar51 = fVar51 * -0.5 * (auVar43._8_4_ * fVar51 * fVar51 + -3.0);
              fVar52 = fVar52 * -0.5 * (auVar43._12_4_ * fVar52 * fVar52 + -3.0);
              auVar70 = vblendps_avx(auVar109,ZEXT1632(CONCAT412(fVar52,CONCAT48(fVar51,CONCAT44(
                                                  auVar93._0_4_,fVar41)))),0xf);
              auVar105 = auVar70._0_28_;
              auVar70 = vblendps_avx(in_ZMM12._0_32_,
                                     ZEXT1632(CONCAT412(fVar52 * -in_ZMM12._12_4_,
                                                        CONCAT48(fVar51 * -in_ZMM12._8_4_,
                                                                 CONCAT44(auVar93._0_4_ *
                                                                          -in_ZMM12._4_4_,
                                                                          fVar41 * -in_ZMM12._0_4_))
                                                       )),0xf);
              in_ZMM12 = ZEXT3264(auVar70);
            }
            else if (iVar5 == 8) {
              auVar93 = vshufps_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),0);
              auVar47._0_4_ = fVar51 + auVar93._0_4_;
              auVar47._4_4_ = auVar109._4_4_ + auVar93._4_4_;
              auVar47._8_4_ = auVar109._8_4_ + auVar93._8_4_;
              auVar47._12_4_ = auVar109._12_4_ + auVar93._12_4_;
              auVar47._16_4_ = auVar109._16_4_ + auVar93._0_4_;
              auVar47._20_4_ = auVar109._20_4_ + auVar93._4_4_;
              auVar47._24_4_ = auVar109._24_4_ + auVar93._8_4_;
              auVar47._28_4_ = auVar109._28_4_ + auVar93._12_4_;
              auVar70 = vrsqrtps_avx(auVar47);
              fVar41 = auVar70._0_4_;
              auVar93._0_4_ = auVar70._4_4_;
              fVar51 = auVar70._8_4_;
              fVar52 = auVar70._12_4_;
              fVar100 = auVar70._16_4_;
              fVar113 = auVar70._20_4_;
              fVar114 = auVar70._24_4_;
              auVar105._0_4_ = fVar41 * -0.5 * (auVar47._0_4_ * fVar41 * fVar41 + -3.0);
              auVar105._4_4_ =
                   auVar93._0_4_ * -0.5 * (auVar47._4_4_ * auVar93._0_4_ * auVar93._0_4_ + -3.0);
              auVar105._8_4_ = fVar51 * -0.5 * (auVar47._8_4_ * fVar51 * fVar51 + -3.0);
              auVar105._12_4_ = fVar52 * -0.5 * (auVar47._12_4_ * fVar52 * fVar52 + -3.0);
              auVar105._16_4_ = fVar100 * -0.5 * (auVar47._16_4_ * fVar100 * fVar100 + -3.0);
              auVar105._20_4_ = fVar113 * -0.5 * (auVar47._20_4_ * fVar113 * fVar113 + -3.0);
              auVar105._24_4_ = fVar114 * -0.5 * (auVar47._24_4_ * fVar114 * fVar114 + -3.0);
              auVar99._0_4_ = auVar105._0_4_ * -in_ZMM12._0_4_;
              auVar99._4_4_ = auVar105._4_4_ * -in_ZMM12._4_4_;
              auVar99._8_4_ = auVar105._8_4_ * -in_ZMM12._8_4_;
              auVar99._12_4_ = auVar105._12_4_ * -in_ZMM12._12_4_;
              auVar99._16_4_ = auVar105._16_4_ * -in_ZMM12._16_4_;
              auVar99._20_4_ = auVar105._20_4_ * -in_ZMM12._20_4_;
              auVar99._28_36_ = in_ZMM12._28_36_;
              auVar99._24_4_ = auVar105._24_4_ * -in_ZMM12._24_4_;
              in_ZMM12 = ZEXT3264(auVar99._0_32_);
            }
            auVar38 = auVar105._0_16_;
            fVar41 = in_ZMM12._0_4_;
            auVar37 = in_ZMM12._0_16_;
            auVar79 = in_ZMM12._0_32_;
            auVar93._0_4_ = auVar105._0_4_;
            if (*(int *)(&this->field_0xd8 + (long)pp_Var7[-3]) == 0) {
              if (!bVar19) {
                auVar38 = vshufps_avx(auVar38,auVar38,0);
                auVar37 = vshufps_avx(auVar37,auVar37,0);
              }
              if (!bVar17) {
                auVar110._16_16_ = auVar38;
                auVar110._0_16_ = auVar38;
                auVar105 = auVar110._0_28_;
                auVar79._16_16_ = auVar37;
                auVar79._0_16_ = auVar37;
              }
              lVar20 = 0;
              iVar30 = 0;
              while (iVar30 + 8 <= iVar28) {
                auVar85._0_4_ = auVar105._0_4_ * *(float *)*pauVar33 + auVar79._0_4_;
                auVar85._4_4_ = auVar105._4_4_ * *(float *)(*pauVar33 + 4) + auVar79._4_4_;
                auVar85._8_4_ = auVar105._8_4_ * *(float *)(*pauVar33 + 8) + auVar79._8_4_;
                auVar85._12_4_ = auVar105._12_4_ * *(float *)(*pauVar33 + 0xc) + auVar79._12_4_;
                auVar85._16_4_ = auVar105._16_4_ * *(float *)(*pauVar33 + 0x10) + auVar79._16_4_;
                auVar85._20_4_ = auVar105._20_4_ * *(float *)(*pauVar33 + 0x14) + auVar79._20_4_;
                auVar85._24_4_ = auVar105._24_4_ * *(float *)(*pauVar33 + 0x18) + auVar79._24_4_;
                auVar85._28_4_ = auVar50._28_4_ + auVar79._28_4_;
                auVar50 = ZEXT3264(auVar85);
                *pauVar33 = auVar85;
                pauVar33 = pauVar33 + 1;
                lVar20 = lVar20 + 8;
                iVar30 = iVar30 + 8;
              }
              while (iVar30 = iVar30 + 4, iVar30 <= iVar28) {
                auVar76._0_4_ = auVar37._0_4_ + auVar38._0_4_ * *(float *)*pauVar33;
                auVar76._4_4_ = auVar37._4_4_ + auVar38._4_4_ * *(float *)(*pauVar33 + 4);
                auVar76._8_4_ = auVar37._8_4_ + auVar38._8_4_ * *(float *)(*pauVar33 + 8);
                auVar76._12_4_ = auVar37._12_4_ + auVar38._12_4_ * *(float *)(*pauVar33 + 0xc);
                *(undefined1 (*) [16])*pauVar33 = auVar76;
                pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
                lVar20 = lVar20 + 4;
              }
              for (; (int)lVar20 < iVar28; lVar20 = lVar20 + 1) {
                *(float *)((long)pvVar11 + lVar20 * 4 + lVar23) =
                     fVar41 + auVar93._0_4_ * *(float *)((long)pvVar11 + lVar20 * 4 + lVar23);
              }
            }
            else {
              fVar113 = auVar105._4_4_;
              fVar114 = auVar105._8_4_;
              fVar115 = auVar105._12_4_;
              fVar51 = in_ZMM12._4_4_;
              fVar52 = in_ZMM12._8_4_;
              fVar100 = in_ZMM12._12_4_;
              pfVar21 = pfVar10;
              pfVar34 = pfVar9;
              if (bVar17) {
                for (iVar30 = 8; iVar30 <= iVar28; iVar30 = iVar30 + 8) {
                  fVar53 = *pfVar34;
                  fVar3 = *pfVar21;
                  auVar48._0_4_ = fVar53 * (fVar41 + auVar93._0_4_ * *(float *)*pauVar33) + fVar3;
                  auVar48._4_4_ = fVar53 * (fVar51 + fVar113 * *(float *)(*pauVar33 + 4)) + fVar3;
                  auVar48._8_4_ = fVar53 * (fVar52 + fVar114 * *(float *)(*pauVar33 + 8)) + fVar3;
                  auVar48._12_4_ =
                       fVar53 * (fVar100 + fVar115 * *(float *)(*pauVar33 + 0xc)) + fVar3;
                  auVar48._16_4_ =
                       fVar53 * (in_ZMM12._16_4_ + auVar105._16_4_ * *(float *)(*pauVar33 + 0x10)) +
                       fVar3;
                  auVar48._20_4_ =
                       fVar53 * (in_ZMM12._20_4_ + auVar105._20_4_ * *(float *)(*pauVar33 + 0x14)) +
                       fVar3;
                  auVar48._24_4_ =
                       fVar53 * (in_ZMM12._24_4_ + auVar105._24_4_ * *(float *)(*pauVar33 + 0x18)) +
                       fVar3;
                  auVar48._28_4_ = fVar53 + fVar3;
                  *pauVar33 = auVar48;
                  pauVar33 = pauVar33 + 1;
                  pfVar34 = pfVar34 + 1;
                  pfVar21 = pfVar21 + 1;
                }
              }
              if (bVar19) {
                pauVar32 = pauVar33;
                for (lVar20 = 0; (int)lVar20 + 8 <= iVar28; lVar20 = lVar20 + 8) {
                  fVar53 = *(float *)((long)pfVar34 + lVar20 + 4);
                  fVar3 = *(float *)((long)pfVar34 + lVar20);
                  fVar4 = *(float *)((long)pfVar21 + lVar20 + 4);
                  fVar54 = *(float *)((long)pfVar21 + lVar20);
                  auVar50 = ZEXT3264(CONCAT1616(CONCAT412(fVar4,CONCAT48(fVar4,CONCAT44(fVar4,fVar4)
                                                                        )),
                                                CONCAT412(fVar54,CONCAT48(fVar54,CONCAT44(fVar54,
                                                  fVar54)))));
                  auVar78._0_4_ = fVar54 + (auVar93._0_4_ * *(float *)*pauVar32 + fVar41) * fVar3;
                  auVar78._4_4_ = fVar54 + (fVar113 * *(float *)(*pauVar32 + 4) + fVar51) * fVar3;
                  auVar78._8_4_ = fVar54 + (fVar114 * *(float *)(*pauVar32 + 8) + fVar52) * fVar3;
                  auVar78._12_4_ =
                       fVar54 + (fVar115 * *(float *)(*pauVar32 + 0xc) + fVar100) * fVar3;
                  auVar78._16_4_ =
                       fVar4 + (auVar93._0_4_ * *(float *)(*pauVar32 + 0x10) + fVar41) * fVar53;
                  auVar78._20_4_ =
                       fVar4 + (fVar113 * *(float *)(*pauVar32 + 0x14) + fVar51) * fVar53;
                  auVar78._24_4_ =
                       fVar4 + (fVar114 * *(float *)(*pauVar32 + 0x18) + fVar52) * fVar53;
                  auVar78._28_4_ = fVar4 + fVar53;
                  *pauVar32 = auVar78;
                  pauVar32 = pauVar32 + 1;
                }
                for (; (int)lVar20 + 4 <= iVar28; lVar20 = lVar20 + 4) {
                  fVar53 = *(float *)((long)pfVar34 + lVar20);
                  fVar3 = *(float *)((long)pfVar21 + lVar20);
                  pfVar26 = (float *)(*pauVar33 + lVar20 * 4);
                  auVar44._0_4_ = fVar53 * (fVar41 + auVar93._0_4_ * *pfVar26) + fVar3;
                  auVar44._4_4_ = fVar53 * (fVar51 + fVar113 * pfVar26[1]) + fVar3;
                  auVar44._8_4_ = fVar53 * (fVar52 + fVar114 * pfVar26[2]) + fVar3;
                  auVar44._12_4_ = fVar53 * (fVar100 + fVar115 * pfVar26[3]) + fVar3;
                  *(undefined1 (*) [16])(*pauVar33 + lVar20 * 4) = auVar44;
                  pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
                }
                pfVar21 = (float *)((long)pfVar21 + lVar20);
                pfVar34 = (float *)((long)pfVar34 + lVar20);
                pauVar33 = pauVar32;
              }
              if (bVar25) {
                auVar38 = vshufps_avx(auVar38,auVar38,0);
                auVar40 = vshufps_avx(auVar37,auVar37,0);
                lVar23 = 0;
                lVar20 = 0;
                pauVar32 = pauVar33;
                pfVar26 = pfVar21;
                pfVar31 = pfVar34;
                iVar30 = 0;
                while( true ) {
                  fVar51 = auVar38._0_4_;
                  fVar52 = auVar38._4_4_;
                  fVar100 = auVar38._8_4_;
                  if (iVar28 < iVar30 + 8) break;
                  auVar84._0_4_ =
                       (fVar51 * *(float *)*pauVar32 + auVar40._0_4_) * *pfVar31 + *pfVar26;
                  auVar84._4_4_ =
                       (fVar52 * *(float *)(*pauVar32 + 4) + auVar40._4_4_) * pfVar31[1] +
                       pfVar26[1];
                  auVar84._8_4_ =
                       (fVar100 * *(float *)(*pauVar32 + 8) + auVar40._8_4_) * pfVar31[2] +
                       pfVar26[2];
                  auVar84._12_4_ =
                       (auVar38._12_4_ * *(float *)(*pauVar32 + 0xc) + auVar40._12_4_) * pfVar31[3]
                       + pfVar26[3];
                  auVar84._16_4_ =
                       (fVar51 * *(float *)(*pauVar32 + 0x10) + auVar40._0_4_) * pfVar31[4] +
                       pfVar26[4];
                  auVar84._20_4_ =
                       (fVar52 * *(float *)(*pauVar32 + 0x14) + auVar40._4_4_) * pfVar31[5] +
                       pfVar26[5];
                  auVar84._24_4_ =
                       (fVar100 * *(float *)(*pauVar32 + 0x18) + auVar40._8_4_) * pfVar31[6] +
                       pfVar26[6];
                  auVar84._28_4_ = auVar50._28_4_ + auVar40._12_4_ + pfVar26[7];
                  auVar50 = ZEXT3264(auVar84);
                  *pauVar32 = auVar84;
                  pauVar32 = pauVar32 + 1;
                  pfVar31 = pfVar31 + 8;
                  pfVar26 = pfVar26 + 8;
                  lVar20 = lVar20 + 0x20;
                  lVar23 = lVar23 + 8;
                  iVar30 = iVar30 + 8;
                }
                auVar37 = vshufps_avx(auVar37,auVar37,0);
                while (iVar30 = iVar30 + 4, iVar30 <= iVar28) {
                  pfVar26 = (float *)(*pauVar33 + lVar20);
                  pfVar31 = (float *)((long)pfVar34 + lVar20);
                  pfVar1 = (float *)((long)pfVar21 + lVar20);
                  auVar75._0_4_ = (fVar51 * *pfVar26 + auVar37._0_4_) * *pfVar31 + *pfVar1;
                  auVar75._4_4_ = (fVar52 * pfVar26[1] + auVar37._4_4_) * pfVar31[1] + pfVar1[1];
                  auVar75._8_4_ = (fVar100 * pfVar26[2] + auVar37._8_4_) * pfVar31[2] + pfVar1[2];
                  auVar75._12_4_ =
                       (auVar38._12_4_ * pfVar26[3] + auVar37._12_4_) * pfVar31[3] + pfVar1[3];
                  *(undefined1 (*) [16])(*pauVar33 + lVar20) = auVar75;
                  lVar20 = lVar20 + 0x10;
                  lVar23 = lVar23 + 4;
                }
                for (; (int)lVar23 < iVar28; lVar23 = lVar23 + 1) {
                  *(float *)(*pauVar33 + lVar23 * 4) =
                       (fVar41 + auVar93._0_4_ * *(float *)(*pauVar33 + lVar23 * 4)) *
                       pfVar34[lVar23] + pfVar21[lVar23];
                }
              }
            }
          }
        }
      }
      else {
        iVar28 = uVar6 * iVar30 * iVar5;
        fVar36 = 1.0 / (float)(int)(uVar6 * iVar30);
        auVar39 = vshufps_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),0);
        for (uVar24 = 0; uVar24 != uVar22; uVar24 = uVar24 + 1) {
          pvVar11 = bottom_top_blob->data;
          pauVar32 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar24 * bottom_top_blob->elemsize + (long)pvVar11);
          fVar41 = *(float *)(&this->field_0xd4 + (long)pp_Var7[-3]);
          lVar20 = 0;
          auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
          pauVar33 = pauVar32;
          iVar30 = 0;
          while( true ) {
            auVar93._0_4_ = auVar50._0_4_;
            fVar51 = auVar50._4_4_;
            fVar52 = auVar50._8_4_;
            fVar100 = auVar50._12_4_;
            fVar113 = auVar50._16_4_;
            fVar114 = auVar50._20_4_;
            fVar115 = auVar50._24_4_;
            if (iVar28 < iVar30 + 8) break;
            auVar50 = ZEXT3264(CONCAT428(auVar50._28_4_ + *(float *)(*pauVar33 + 0x1c),
                                         CONCAT424(fVar115 + *(float *)(*pauVar33 + 0x18),
                                                   CONCAT420(fVar114 + *(float *)(*pauVar33 + 0x14),
                                                             CONCAT416(fVar113 + *(float *)(*
                                                  pauVar33 + 0x10),
                                                  CONCAT412(fVar100 + *(float *)(*pauVar33 + 0xc),
                                                            CONCAT48(fVar52 + *(float *)(*pauVar33 +
                                                                                        8),
                                                                     CONCAT44(fVar51 + *(float *)(*
                                                  pauVar33 + 4),auVar93._0_4_ + *(float *)*pauVar33)
                                                  )))))));
            pauVar33 = pauVar33 + 1;
            lVar20 = lVar20 + 8;
            iVar30 = iVar30 + 8;
          }
          auVar64 = ZEXT816(0) << 0x40;
          while( true ) {
            iVar30 = iVar30 + 4;
            fVar54 = auVar64._0_4_;
            fVar53 = auVar64._4_4_;
            fVar3 = auVar64._8_4_;
            fVar4 = auVar64._12_4_;
            if (iVar28 < iVar30) break;
            auVar64._0_4_ = fVar54 + *(float *)*pauVar33;
            auVar64._4_4_ = fVar53 + *(float *)(*pauVar33 + 4);
            auVar64._8_4_ = fVar3 + *(float *)(*pauVar33 + 8);
            auVar64._12_4_ = fVar4 + *(float *)(*pauVar33 + 0xc);
            pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
            lVar20 = lVar20 + 4;
          }
          lVar23 = bottom_top_blob->cstep * bottom_top_blob->elemsize * uVar24;
          fVar74 = 0.0;
          for (; (int)lVar20 < iVar28; lVar20 = lVar20 + 1) {
            fVar74 = fVar74 + *(float *)((long)pvVar11 + lVar20 * 4 + lVar23);
          }
          fVar13 = auVar39._0_4_;
          fVar14 = auVar39._4_4_;
          fVar15 = auVar39._8_4_;
          fVar16 = auVar39._12_4_;
          if (iVar5 == 8) {
            auVar89._0_4_ = auVar93._0_4_ * fVar13;
            auVar89._4_4_ = fVar51 * fVar14;
            auVar89._8_4_ = fVar52 * fVar15;
            auVar95._12_4_ = fVar100 * fVar16;
            auVar95._0_12_ = auVar89;
            auVar50._16_4_ = fVar113 * fVar13;
            auVar50._0_16_ = auVar95;
            auVar50._20_4_ = fVar114 * fVar14;
            auVar50._28_36_ = in_ZMM12._28_36_;
            auVar50._24_4_ = fVar115 * fVar15;
            auVar72 = auVar50._0_32_;
            in_ZMM12 = ZEXT3264(auVar72);
            auVar103 = vshufps_avx(auVar95,auVar95,0);
            bVar19 = true;
            bVar17 = false;
            bVar25 = false;
          }
          else {
            if (iVar5 == 4) {
              auVar89._0_4_ = (fVar113 + auVar93._0_4_ + fVar54) * fVar13;
              auVar89._4_4_ = (fVar114 + fVar51 + fVar53) * fVar14;
              auVar89._8_4_ = (fVar115 + fVar52 + fVar3) * fVar15;
              auVar103._12_4_ = (auVar50._28_4_ + fVar100 + fVar4) * fVar16;
              auVar103._0_12_ = auVar89;
              bVar25 = true;
              bVar17 = false;
              auVar94 = auVar103;
            }
            else {
              if (iVar5 != 1) {
                auVar89 = SUB1612(ZEXT816(0),0) << 0x40;
                auVar94 = ZEXT816(0) << 0x40;
                auVar103 = ZEXT816(0) << 0x40;
              }
              else {
                auVar38 = vshufpd_avx(auVar64,auVar64,1);
                auVar93 = vhaddps_avx(auVar50._16_16_,auVar50._0_16_);
                auVar65._0_4_ = auVar38._0_4_ + fVar54;
                auVar65._4_4_ = auVar38._4_4_ + fVar53;
                auVar65._8_4_ = auVar38._8_4_ + fVar3;
                auVar65._12_4_ = auVar38._12_4_ + fVar4;
                auVar93 = vhaddps_avx(auVar93,auVar93);
                auVar38 = vmovshdup_avx(auVar65);
                auVar93 = vhaddps_avx(auVar93,auVar93);
                auVar93._0_4_ = (auVar93._0_4_ + auVar38._0_4_ + auVar65._0_4_ + fVar74) * fVar36;
                auVar89._4_8_ = 0;
                auVar89._0_4_ = auVar93._0_4_;
                auVar94._4_8_ = SUB128(ZEXT812(0),4);
                auVar94._0_4_ = auVar93._0_4_;
                auVar94._12_4_ = 0;
                auVar103 = vshufps_avx(ZEXT416((uint)auVar93._0_4_),ZEXT416((uint)auVar93._0_4_),0);
              }
              bVar17 = iVar5 == 1;
              bVar25 = false;
            }
            in_ZMM12 = ZEXT1664(auVar94);
            auVar72._16_16_ = auVar103;
            auVar72._0_16_ = auVar103;
            bVar19 = false;
          }
          lVar20 = 0;
          auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
          pauVar33 = pauVar32;
          iVar30 = 0;
          while( true ) {
            auVar93._0_4_ = auVar50._0_4_;
            fVar51 = auVar50._4_4_;
            fVar52 = auVar50._8_4_;
            fVar100 = auVar50._12_4_;
            fVar113 = auVar50._16_4_;
            fVar114 = auVar50._20_4_;
            fVar115 = auVar50._24_4_;
            if (iVar28 < iVar30 + 8) break;
            auVar70 = vsubps_avx(*pauVar33,auVar72);
            auVar50 = ZEXT3264(CONCAT428(auVar70._28_4_ + auVar50._28_4_,
                                         CONCAT424(auVar70._24_4_ * auVar70._24_4_ + fVar115,
                                                   CONCAT420(auVar70._20_4_ * auVar70._20_4_ +
                                                             fVar114,CONCAT416(auVar70._16_4_ *
                                                                               auVar70._16_4_ +
                                                                               fVar113,CONCAT412(
                                                  auVar70._12_4_ * auVar70._12_4_ + fVar100,
                                                  CONCAT48(auVar70._8_4_ * auVar70._8_4_ + fVar52,
                                                           CONCAT44(auVar70._4_4_ * auVar70._4_4_ +
                                                                    fVar51,auVar70._0_4_ *
                                                                           auVar70._0_4_ +
                                                                           auVar93._0_4_))))))));
            pauVar33 = pauVar33 + 1;
            lVar20 = lVar20 + 8;
            iVar30 = iVar30 + 8;
          }
          auVar66 = ZEXT816(0) << 0x20;
          while( true ) {
            iVar30 = iVar30 + 4;
            fVar53 = auVar66._4_4_;
            fVar3 = auVar66._8_4_;
            fVar4 = auVar66._12_4_;
            if (iVar28 < iVar30) break;
            auVar38 = vsubps_avx(*(undefined1 (*) [16])*pauVar33,auVar103);
            auVar66._0_4_ = auVar38._0_4_ * auVar38._0_4_ + auVar66._0_4_;
            auVar66._4_4_ = auVar38._4_4_ * auVar38._4_4_ + fVar53;
            auVar66._8_4_ = auVar38._8_4_ * auVar38._8_4_ + fVar3;
            auVar66._12_4_ = auVar38._12_4_ * auVar38._12_4_ + fVar4;
            pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
            lVar20 = lVar20 + 4;
          }
          fVar54 = 0.0;
          for (; (int)lVar20 < iVar28; lVar20 = lVar20 + 1) {
            fVar74 = *(float *)((long)pvVar11 + lVar20 * 4 + lVar23) - auVar89._0_4_;
            fVar54 = fVar74 * fVar74 + fVar54;
          }
          if (bVar19) {
            auVar111._0_4_ = auVar93._0_4_ * fVar13;
            auVar111._4_4_ = fVar51 * fVar14;
            auVar111._8_4_ = fVar52 * fVar15;
            auVar111._12_4_ = fVar100 * fVar16;
            auVar111._16_4_ = fVar113 * fVar13;
            auVar111._20_4_ = fVar114 * fVar14;
            auVar111._24_4_ = fVar115 * fVar15;
            auVar111._28_4_ = 0;
          }
          else {
            auVar111 = ZEXT1232(ZEXT812(0)) << 0x20;
          }
          auVar38 = auVar50._16_16_;
          if (bVar25) {
            auVar66._0_4_ = fVar113 + auVar93._0_4_ + auVar66._0_4_;
            auVar66._4_4_ = fVar114 + fVar51 + fVar53;
            auVar66._8_4_ = fVar115 + fVar52 + fVar3;
            auVar66._12_4_ = auVar50._28_4_ + fVar100 + fVar4;
            auVar111 = vblendps_avx(auVar111,ZEXT1632(CONCAT412(auVar66._12_4_ * fVar16,
                                                                CONCAT48(auVar66._8_4_ * fVar15,
                                                                         CONCAT44(auVar66._4_4_ *
                                                                                  fVar14,auVar66.
                                                  _0_4_ * fVar13)))),0xf);
          }
          if (bVar17) {
            auVar93 = vshufpd_avx(auVar66,auVar66,1);
            auVar67._0_4_ = auVar93._0_4_ + auVar66._0_4_;
            auVar67._4_4_ = auVar93._4_4_ + auVar66._4_4_;
            auVar67._8_4_ = auVar93._8_4_ + auVar66._8_4_;
            auVar67._12_4_ = auVar93._12_4_ + auVar66._12_4_;
            auVar93 = vhaddps_avx(auVar38,auVar50._0_16_);
            auVar38 = vmovshdup_avx(auVar67);
            auVar93 = vhaddps_avx(auVar93,auVar93);
            auVar93 = vhaddps_avx(auVar93,auVar93);
            auVar111 = vblendps_avx(auVar111,ZEXT432((uint)((auVar93._0_4_ +
                                                            fVar54 + auVar38._0_4_ + auVar67._0_4_)
                                                           * fVar36)),1);
          }
          auVar50 = ZEXT1664(auVar38);
          auVar93._0_4_ = auVar111._0_4_;
          auVar106 = auVar111._0_28_;
          if (iVar5 == 1) {
            auVar93._0_4_ = auVar93._0_4_ + fVar41;
            auVar38 = vrsqrtss_avx(ZEXT416((uint)auVar93._0_4_),ZEXT416((uint)auVar93._0_4_));
            fVar41 = auVar38._0_4_;
            fVar41 = fVar41 * -0.5 * (auVar93._0_4_ * fVar41 * fVar41 + -3.0);
            auVar70 = vblendps_avx(auVar111,ZEXT432((uint)fVar41),1);
            auVar106 = auVar70._0_28_;
            auVar70 = vblendps_avx(in_ZMM12._0_32_,ZEXT432((uint)(fVar41 * -auVar89._0_4_)),1);
            in_ZMM12 = ZEXT3264(auVar70);
          }
          else if (iVar5 == 4) {
            auVar38 = vshufps_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),0);
            auVar45._0_4_ = auVar93._0_4_ + auVar38._0_4_;
            auVar45._4_4_ = auVar111._4_4_ + auVar38._4_4_;
            auVar45._8_4_ = auVar111._8_4_ + auVar38._8_4_;
            auVar45._12_4_ = auVar111._12_4_ + auVar38._12_4_;
            auVar38 = vrsqrtps_avx(auVar45);
            fVar41 = auVar38._0_4_;
            auVar93._0_4_ = auVar38._4_4_;
            fVar51 = auVar38._8_4_;
            fVar52 = auVar38._12_4_;
            fVar41 = fVar41 * -0.5 * (auVar45._0_4_ * fVar41 * fVar41 + -3.0);
            auVar93._0_4_ =
                 auVar93._0_4_ * -0.5 * (auVar45._4_4_ * auVar93._0_4_ * auVar93._0_4_ + -3.0);
            fVar51 = fVar51 * -0.5 * (auVar45._8_4_ * fVar51 * fVar51 + -3.0);
            fVar52 = fVar52 * -0.5 * (auVar45._12_4_ * fVar52 * fVar52 + -3.0);
            auVar70 = vblendps_avx(auVar111,ZEXT1632(CONCAT412(fVar52,CONCAT48(fVar51,CONCAT44(
                                                  auVar93._0_4_,fVar41)))),0xf);
            auVar106 = auVar70._0_28_;
            auVar70 = vblendps_avx(in_ZMM12._0_32_,
                                   ZEXT1632(CONCAT412(fVar52 * -in_ZMM12._12_4_,
                                                      CONCAT48(fVar51 * -in_ZMM12._8_4_,
                                                               CONCAT44(auVar93._0_4_ *
                                                                        -in_ZMM12._4_4_,
                                                                        fVar41 * -in_ZMM12._0_4_))))
                                   ,0xf);
            in_ZMM12 = ZEXT3264(auVar70);
          }
          else if (iVar5 == 8) {
            auVar38 = vshufps_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),0);
            auVar49._0_4_ = auVar93._0_4_ + auVar38._0_4_;
            auVar49._4_4_ = auVar111._4_4_ + auVar38._4_4_;
            auVar49._8_4_ = auVar111._8_4_ + auVar38._8_4_;
            auVar49._12_4_ = auVar111._12_4_ + auVar38._12_4_;
            auVar49._16_4_ = auVar111._16_4_ + auVar38._0_4_;
            auVar49._20_4_ = auVar111._20_4_ + auVar38._4_4_;
            auVar49._24_4_ = auVar111._24_4_ + auVar38._8_4_;
            auVar49._28_4_ = auVar111._28_4_ + auVar38._12_4_;
            auVar70 = vrsqrtps_avx(auVar49);
            fVar41 = auVar70._0_4_;
            auVar93._0_4_ = auVar70._4_4_;
            fVar51 = auVar70._8_4_;
            fVar52 = auVar70._12_4_;
            fVar100 = auVar70._16_4_;
            fVar113 = auVar70._20_4_;
            fVar114 = auVar70._24_4_;
            auVar106._0_4_ = fVar41 * -0.5 * (auVar49._0_4_ * fVar41 * fVar41 + -3.0);
            auVar106._4_4_ =
                 auVar93._0_4_ * -0.5 * (auVar49._4_4_ * auVar93._0_4_ * auVar93._0_4_ + -3.0);
            auVar106._8_4_ = fVar51 * -0.5 * (auVar49._8_4_ * fVar51 * fVar51 + -3.0);
            auVar106._12_4_ = fVar52 * -0.5 * (auVar49._12_4_ * fVar52 * fVar52 + -3.0);
            auVar106._16_4_ = fVar100 * -0.5 * (auVar49._16_4_ * fVar100 * fVar100 + -3.0);
            auVar106._20_4_ = fVar113 * -0.5 * (auVar49._20_4_ * fVar113 * fVar113 + -3.0);
            auVar106._24_4_ = fVar114 * -0.5 * (auVar49._24_4_ * fVar114 * fVar114 + -3.0);
            auVar81._0_4_ = auVar106._0_4_ * -in_ZMM12._0_4_;
            auVar81._4_4_ = auVar106._4_4_ * -in_ZMM12._4_4_;
            auVar81._8_4_ = auVar106._8_4_ * -in_ZMM12._8_4_;
            auVar81._12_4_ = auVar106._12_4_ * -in_ZMM12._12_4_;
            auVar81._16_4_ = auVar106._16_4_ * -in_ZMM12._16_4_;
            auVar81._20_4_ = auVar106._20_4_ * -in_ZMM12._20_4_;
            auVar81._28_36_ = in_ZMM12._28_36_;
            auVar81._24_4_ = auVar106._24_4_ * -in_ZMM12._24_4_;
            in_ZMM12 = ZEXT3264(auVar81._0_32_);
          }
          auVar38 = auVar106._0_16_;
          fVar41 = in_ZMM12._0_4_;
          auVar37 = in_ZMM12._0_16_;
          auVar80 = in_ZMM12._0_32_;
          auVar93._0_4_ = auVar106._0_4_;
          if (*(int *)(&this->field_0xd8 + (long)pp_Var7[-3]) == 0) {
            if (!bVar25) {
              auVar38 = vshufps_avx(auVar38,auVar38,0);
              auVar37 = vshufps_avx(auVar37,auVar37,0);
            }
            if (!bVar19) {
              auVar112._16_16_ = auVar38;
              auVar112._0_16_ = auVar38;
              auVar106 = auVar112._0_28_;
              auVar80._16_16_ = auVar37;
              auVar80._0_16_ = auVar37;
            }
            lVar20 = 0;
            iVar30 = 0;
            while (iVar30 + 8 <= iVar28) {
              auVar87._0_4_ = auVar106._0_4_ * *(float *)*pauVar32 + auVar80._0_4_;
              auVar87._4_4_ = auVar106._4_4_ * *(float *)(*pauVar32 + 4) + auVar80._4_4_;
              auVar87._8_4_ = auVar106._8_4_ * *(float *)(*pauVar32 + 8) + auVar80._8_4_;
              auVar87._12_4_ = auVar106._12_4_ * *(float *)(*pauVar32 + 0xc) + auVar80._12_4_;
              auVar87._16_4_ = auVar106._16_4_ * *(float *)(*pauVar32 + 0x10) + auVar80._16_4_;
              auVar87._20_4_ = auVar106._20_4_ * *(float *)(*pauVar32 + 0x14) + auVar80._20_4_;
              auVar87._24_4_ = auVar106._24_4_ * *(float *)(*pauVar32 + 0x18) + auVar80._24_4_;
              auVar87._28_4_ = auVar50._28_4_ + auVar80._28_4_;
              auVar50 = ZEXT3264(auVar87);
              *pauVar32 = auVar87;
              pauVar32 = pauVar32 + 1;
              lVar20 = lVar20 + 8;
              iVar30 = iVar30 + 8;
            }
            while (iVar30 = iVar30 + 4, iVar30 <= iVar28) {
              fVar51 = *(float *)(*pauVar32 + 4);
              fVar52 = *(float *)(*pauVar32 + 8);
              fVar100 = *(float *)(*pauVar32 + 0xc);
              *(float *)*pauVar32 = auVar37._0_4_ + auVar38._0_4_ * *(float *)*pauVar32;
              *(float *)(*pauVar32 + 4) = auVar37._4_4_ + auVar38._4_4_ * fVar51;
              *(float *)(*pauVar32 + 8) = auVar37._8_4_ + auVar38._8_4_ * fVar52;
              *(float *)(*pauVar32 + 0xc) = auVar37._12_4_ + auVar38._12_4_ * fVar100;
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
              lVar20 = lVar20 + 4;
            }
            for (; (int)lVar20 < iVar28; lVar20 = lVar20 + 1) {
              *(float *)((long)pvVar11 + lVar20 * 4 + lVar23) =
                   fVar41 + auVar93._0_4_ * *(float *)((long)pvVar11 + lVar20 * 4 + lVar23);
            }
          }
          else {
            fVar113 = auVar106._4_4_;
            fVar114 = auVar106._8_4_;
            fVar115 = auVar106._12_4_;
            fVar51 = in_ZMM12._4_4_;
            fVar52 = in_ZMM12._8_4_;
            fVar100 = in_ZMM12._12_4_;
            pfVar21 = pfVar10;
            pfVar34 = pfVar9;
            if (bVar19) {
              for (iVar30 = 8; iVar30 <= iVar28; iVar30 = iVar30 + 8) {
                fVar53 = *pfVar34;
                fVar3 = *pfVar21;
                fVar4 = *(float *)(*pauVar32 + 4);
                fVar54 = *(float *)(*pauVar32 + 8);
                fVar74 = *(float *)(*pauVar32 + 0xc);
                fVar13 = *(float *)(*pauVar32 + 0x10);
                fVar14 = *(float *)(*pauVar32 + 0x14);
                fVar15 = *(float *)(*pauVar32 + 0x18);
                *(float *)*pauVar32 =
                     fVar53 * (fVar41 + auVar93._0_4_ * *(float *)*pauVar32) + fVar3;
                *(float *)(*pauVar32 + 4) = fVar53 * (fVar51 + fVar113 * fVar4) + fVar3;
                *(float *)(*pauVar32 + 8) = fVar53 * (fVar52 + fVar114 * fVar54) + fVar3;
                *(float *)(*pauVar32 + 0xc) = fVar53 * (fVar100 + fVar115 * fVar74) + fVar3;
                *(float *)(*pauVar32 + 0x10) =
                     fVar53 * (in_ZMM12._16_4_ + auVar106._16_4_ * fVar13) + fVar3;
                *(float *)(*pauVar32 + 0x14) =
                     fVar53 * (in_ZMM12._20_4_ + auVar106._20_4_ * fVar14) + fVar3;
                *(float *)(*pauVar32 + 0x18) =
                     fVar53 * (in_ZMM12._24_4_ + auVar106._24_4_ * fVar15) + fVar3;
                *(float *)(*pauVar32 + 0x1c) = fVar53 + fVar3;
                pauVar32 = pauVar32 + 1;
                pfVar34 = pfVar34 + 1;
                pfVar21 = pfVar21 + 1;
              }
            }
            if (bVar25) {
              pauVar33 = pauVar32;
              for (lVar20 = 0; (int)lVar20 + 8 <= iVar28; lVar20 = lVar20 + 8) {
                fVar53 = *(float *)((long)pfVar34 + lVar20 + 4);
                fVar3 = *(float *)((long)pfVar34 + lVar20);
                fVar4 = *(float *)((long)pfVar21 + lVar20 + 4);
                fVar54 = *(float *)((long)pfVar21 + lVar20);
                auVar50 = ZEXT3264(CONCAT1616(CONCAT412(fVar4,CONCAT48(fVar4,CONCAT44(fVar4,fVar4)))
                                              ,CONCAT412(fVar54,CONCAT48(fVar54,CONCAT44(fVar54,
                                                  fVar54)))));
                fVar74 = *(float *)(*pauVar33 + 4);
                fVar13 = *(float *)(*pauVar33 + 8);
                fVar14 = *(float *)(*pauVar33 + 0xc);
                fVar15 = *(float *)(*pauVar33 + 0x10);
                fVar16 = *(float *)(*pauVar33 + 0x14);
                fVar18 = *(float *)(*pauVar33 + 0x18);
                *(float *)*pauVar33 =
                     fVar54 + (auVar93._0_4_ * *(float *)*pauVar33 + fVar41) * fVar3;
                *(float *)(*pauVar33 + 4) = fVar54 + (fVar113 * fVar74 + fVar51) * fVar3;
                *(float *)(*pauVar33 + 8) = fVar54 + (fVar114 * fVar13 + fVar52) * fVar3;
                *(float *)(*pauVar33 + 0xc) = fVar54 + (fVar115 * fVar14 + fVar100) * fVar3;
                *(float *)(*pauVar33 + 0x10) = fVar4 + (auVar93._0_4_ * fVar15 + fVar41) * fVar53;
                *(float *)(*pauVar33 + 0x14) = fVar4 + (fVar113 * fVar16 + fVar51) * fVar53;
                *(float *)(*pauVar33 + 0x18) = fVar4 + (fVar114 * fVar18 + fVar52) * fVar53;
                *(float *)(*pauVar33 + 0x1c) = fVar4 + fVar53;
                pauVar33 = pauVar33 + 1;
              }
              for (; (int)lVar20 + 4 <= iVar28; lVar20 = lVar20 + 4) {
                fVar53 = *(float *)((long)pfVar34 + lVar20);
                fVar3 = *(float *)((long)pfVar21 + lVar20);
                pfVar26 = (float *)(*pauVar32 + lVar20 * 4);
                fVar4 = pfVar26[1];
                fVar54 = pfVar26[2];
                fVar74 = pfVar26[3];
                pfVar31 = (float *)(*pauVar32 + lVar20 * 4);
                *pfVar31 = fVar53 * (fVar41 + auVar93._0_4_ * *pfVar26) + fVar3;
                pfVar31[1] = fVar53 * (fVar51 + fVar113 * fVar4) + fVar3;
                pfVar31[2] = fVar53 * (fVar52 + fVar114 * fVar54) + fVar3;
                pfVar31[3] = fVar53 * (fVar100 + fVar115 * fVar74) + fVar3;
                pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
              }
              pfVar21 = (float *)((long)pfVar21 + lVar20);
              pfVar34 = (float *)((long)pfVar34 + lVar20);
              pauVar32 = pauVar33;
            }
            if (bVar17) {
              auVar38 = vshufps_avx(auVar38,auVar38,0);
              auVar40 = vshufps_avx(auVar37,auVar37,0);
              lVar23 = 0;
              lVar20 = 0;
              pauVar33 = pauVar32;
              pfVar26 = pfVar21;
              pfVar31 = pfVar34;
              iVar30 = 0;
              while( true ) {
                fVar51 = auVar38._0_4_;
                fVar52 = auVar38._4_4_;
                fVar100 = auVar38._8_4_;
                if (iVar28 < iVar30 + 8) break;
                auVar86._0_4_ = (fVar51 * *(float *)*pauVar33 + auVar40._0_4_) * *pfVar31 + *pfVar26
                ;
                auVar86._4_4_ =
                     (fVar52 * *(float *)(*pauVar33 + 4) + auVar40._4_4_) * pfVar31[1] + pfVar26[1];
                auVar86._8_4_ =
                     (fVar100 * *(float *)(*pauVar33 + 8) + auVar40._8_4_) * pfVar31[2] + pfVar26[2]
                ;
                auVar86._12_4_ =
                     (auVar38._12_4_ * *(float *)(*pauVar33 + 0xc) + auVar40._12_4_) * pfVar31[3] +
                     pfVar26[3];
                auVar86._16_4_ =
                     (fVar51 * *(float *)(*pauVar33 + 0x10) + auVar40._0_4_) * pfVar31[4] +
                     pfVar26[4];
                auVar86._20_4_ =
                     (fVar52 * *(float *)(*pauVar33 + 0x14) + auVar40._4_4_) * pfVar31[5] +
                     pfVar26[5];
                auVar86._24_4_ =
                     (fVar100 * *(float *)(*pauVar33 + 0x18) + auVar40._8_4_) * pfVar31[6] +
                     pfVar26[6];
                auVar86._28_4_ = auVar50._28_4_ + auVar40._12_4_ + pfVar26[7];
                auVar50 = ZEXT3264(auVar86);
                *pauVar33 = auVar86;
                pauVar33 = pauVar33 + 1;
                pfVar31 = pfVar31 + 8;
                pfVar26 = pfVar26 + 8;
                lVar20 = lVar20 + 0x20;
                lVar23 = lVar23 + 8;
                iVar30 = iVar30 + 8;
              }
              auVar37 = vshufps_avx(auVar37,auVar37,0);
              while (iVar30 = iVar30 + 4, iVar30 <= iVar28) {
                pfVar26 = (float *)(*pauVar32 + lVar20);
                fVar113 = pfVar26[1];
                fVar114 = pfVar26[2];
                fVar115 = pfVar26[3];
                pfVar31 = (float *)((long)pfVar34 + lVar20);
                fVar53 = pfVar31[1];
                fVar3 = pfVar31[2];
                fVar4 = pfVar31[3];
                pfVar1 = (float *)((long)pfVar21 + lVar20);
                fVar54 = pfVar1[1];
                fVar74 = pfVar1[2];
                fVar13 = pfVar1[3];
                pfVar2 = (float *)(*pauVar32 + lVar20);
                *pfVar2 = (fVar51 * *pfVar26 + auVar37._0_4_) * *pfVar31 + *pfVar1;
                pfVar2[1] = (fVar52 * fVar113 + auVar37._4_4_) * fVar53 + fVar54;
                pfVar2[2] = (fVar100 * fVar114 + auVar37._8_4_) * fVar3 + fVar74;
                pfVar2[3] = (auVar38._12_4_ * fVar115 + auVar37._12_4_) * fVar4 + fVar13;
                lVar20 = lVar20 + 0x10;
                lVar23 = lVar23 + 4;
              }
              for (; (int)lVar23 < iVar28; lVar23 = lVar23 + 1) {
                *(float *)(*pauVar32 + lVar23 * 4) =
                     (fVar41 + auVar93._0_4_ * *(float *)(*pauVar32 + lVar23 * 4)) * pfVar34[lVar23]
                     + pfVar21[lVar23];
              }
            }
          }
        }
      }
    }
    else if (iVar28 == 2) {
      iVar28 = iVar30 * iVar5;
      fVar36 = 1.0 / (float)iVar30;
      auVar39 = vshufps_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),0);
      uVar24 = 0;
      uVar22 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar22 = uVar24;
      }
      for (; uVar24 != uVar22; uVar24 = uVar24 + 1) {
        pvVar11 = bottom_top_blob->data;
        pauVar32 = (undefined1 (*) [32])
                   (uVar24 * (long)bottom_top_blob->w * bottom_top_blob->elemsize + (long)pvVar11);
        fVar41 = *(float *)(&this->field_0xd4 + (long)pp_Var7[-3]);
        lVar20 = 0;
        auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
        pauVar33 = pauVar32;
        iVar30 = 0;
        while( true ) {
          auVar93._0_4_ = auVar50._0_4_;
          fVar51 = auVar50._4_4_;
          fVar52 = auVar50._8_4_;
          fVar100 = auVar50._12_4_;
          fVar113 = auVar50._16_4_;
          fVar114 = auVar50._20_4_;
          fVar115 = auVar50._24_4_;
          if (iVar28 < iVar30 + 8) break;
          auVar50 = ZEXT3264(CONCAT428(auVar50._28_4_ + *(float *)(*pauVar33 + 0x1c),
                                       CONCAT424(fVar115 + *(float *)(*pauVar33 + 0x18),
                                                 CONCAT420(fVar114 + *(float *)(*pauVar33 + 0x14),
                                                           CONCAT416(fVar113 + *(float *)(*pauVar33
                                                                                         + 0x10),
                                                                     CONCAT412(fVar100 + *(float *)(
                                                  *pauVar33 + 0xc),
                                                  CONCAT48(fVar52 + *(float *)(*pauVar33 + 8),
                                                           CONCAT44(fVar51 + *(float *)(*pauVar33 +
                                                                                       4),
                                                                    auVar93._0_4_ +
                                                                    *(float *)*pauVar33))))))));
          pauVar33 = pauVar33 + 1;
          lVar20 = lVar20 + 8;
          iVar30 = iVar30 + 8;
        }
        auVar55 = ZEXT816(0) << 0x40;
        while( true ) {
          iVar30 = iVar30 + 4;
          fVar54 = auVar55._0_4_;
          fVar53 = auVar55._4_4_;
          fVar3 = auVar55._8_4_;
          fVar4 = auVar55._12_4_;
          if (iVar28 < iVar30) break;
          auVar55._0_4_ = fVar54 + *(float *)*pauVar33;
          auVar55._4_4_ = fVar53 + *(float *)(*pauVar33 + 4);
          auVar55._8_4_ = fVar3 + *(float *)(*pauVar33 + 8);
          auVar55._12_4_ = fVar4 + *(float *)(*pauVar33 + 0xc);
          pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
          lVar20 = lVar20 + 4;
        }
        lVar23 = bottom_top_blob->elemsize * uVar24 * (long)bottom_top_blob->w;
        fVar74 = 0.0;
        for (; (int)lVar20 < iVar28; lVar20 = lVar20 + 1) {
          fVar74 = fVar74 + *(float *)((long)pvVar11 + lVar20 * 4 + lVar23);
        }
        fVar13 = auVar39._0_4_;
        fVar14 = auVar39._4_4_;
        fVar15 = auVar39._8_4_;
        fVar16 = auVar39._12_4_;
        if (iVar5 == 8) {
          auVar88._0_4_ = auVar93._0_4_ * fVar13;
          auVar88._4_4_ = fVar51 * fVar14;
          auVar88._8_4_ = fVar52 * fVar15;
          auVar91._12_4_ = fVar100 * fVar16;
          auVar91._0_12_ = auVar88;
          auVar96._16_4_ = fVar113 * fVar13;
          auVar96._0_16_ = auVar91;
          auVar96._20_4_ = fVar114 * fVar14;
          auVar96._28_36_ = in_ZMM12._28_36_;
          auVar96._24_4_ = fVar115 * fVar15;
          auVar68 = auVar96._0_32_;
          in_ZMM12 = ZEXT3264(auVar68);
          auVar101 = vshufps_avx(auVar91,auVar91,0);
          bVar19 = true;
          bVar17 = false;
          bVar25 = false;
        }
        else {
          if (iVar5 == 4) {
            auVar88._0_4_ = (fVar113 + auVar93._0_4_ + fVar54) * fVar13;
            auVar88._4_4_ = (fVar114 + fVar51 + fVar53) * fVar14;
            auVar88._8_4_ = (fVar115 + fVar52 + fVar3) * fVar15;
            auVar101._12_4_ = (auVar50._28_4_ + fVar100 + fVar4) * fVar16;
            auVar101._0_12_ = auVar88;
            bVar25 = true;
            bVar17 = false;
            auVar90 = auVar101;
          }
          else {
            if (iVar5 != 1) {
              auVar88 = SUB1612(ZEXT816(0),0) << 0x40;
              auVar90 = ZEXT816(0) << 0x40;
              auVar101 = ZEXT816(0) << 0x40;
            }
            else {
              auVar38 = vshufpd_avx(auVar55,auVar55,1);
              auVar93 = vhaddps_avx(auVar50._16_16_,auVar50._0_16_);
              auVar56._0_4_ = auVar38._0_4_ + fVar54;
              auVar56._4_4_ = auVar38._4_4_ + fVar53;
              auVar56._8_4_ = auVar38._8_4_ + fVar3;
              auVar56._12_4_ = auVar38._12_4_ + fVar4;
              auVar93 = vhaddps_avx(auVar93,auVar93);
              auVar38 = vmovshdup_avx(auVar56);
              auVar93 = vhaddps_avx(auVar93,auVar93);
              auVar93._0_4_ = (auVar93._0_4_ + auVar38._0_4_ + auVar56._0_4_ + fVar74) * fVar36;
              auVar88._4_8_ = 0;
              auVar88._0_4_ = auVar93._0_4_;
              auVar90._4_8_ = SUB128(ZEXT812(0),4);
              auVar90._0_4_ = auVar93._0_4_;
              auVar90._12_4_ = 0;
              auVar101 = vshufps_avx(ZEXT416((uint)auVar93._0_4_),ZEXT416((uint)auVar93._0_4_),0);
            }
            bVar17 = iVar5 == 1;
            bVar25 = false;
          }
          in_ZMM12 = ZEXT1664(auVar90);
          auVar68._16_16_ = auVar101;
          auVar68._0_16_ = auVar101;
          bVar19 = false;
        }
        lVar20 = 0;
        auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
        pauVar33 = pauVar32;
        iVar30 = 0;
        while( true ) {
          auVar93._0_4_ = auVar50._0_4_;
          fVar51 = auVar50._4_4_;
          fVar52 = auVar50._8_4_;
          fVar100 = auVar50._12_4_;
          fVar113 = auVar50._16_4_;
          fVar114 = auVar50._20_4_;
          fVar115 = auVar50._24_4_;
          if (iVar28 < iVar30 + 8) break;
          auVar70 = vsubps_avx(*pauVar33,auVar68);
          auVar50 = ZEXT3264(CONCAT428(auVar70._28_4_ + auVar50._28_4_,
                                       CONCAT424(auVar70._24_4_ * auVar70._24_4_ + fVar115,
                                                 CONCAT420(auVar70._20_4_ * auVar70._20_4_ + fVar114
                                                           ,CONCAT416(auVar70._16_4_ *
                                                                      auVar70._16_4_ + fVar113,
                                                                      CONCAT412(auVar70._12_4_ *
                                                                                auVar70._12_4_ +
                                                                                fVar100,CONCAT48(
                                                  auVar70._8_4_ * auVar70._8_4_ + fVar52,
                                                  CONCAT44(auVar70._4_4_ * auVar70._4_4_ + fVar51,
                                                           auVar70._0_4_ * auVar70._0_4_ +
                                                           auVar93._0_4_))))))));
          pauVar33 = pauVar33 + 1;
          lVar20 = lVar20 + 8;
          iVar30 = iVar30 + 8;
        }
        auVar57 = ZEXT816(0) << 0x20;
        while( true ) {
          iVar30 = iVar30 + 4;
          fVar53 = auVar57._4_4_;
          fVar3 = auVar57._8_4_;
          fVar4 = auVar57._12_4_;
          if (iVar28 < iVar30) break;
          auVar38 = vsubps_avx(*(undefined1 (*) [16])*pauVar33,auVar101);
          auVar57._0_4_ = auVar38._0_4_ * auVar38._0_4_ + auVar57._0_4_;
          auVar57._4_4_ = auVar38._4_4_ * auVar38._4_4_ + fVar53;
          auVar57._8_4_ = auVar38._8_4_ * auVar38._8_4_ + fVar3;
          auVar57._12_4_ = auVar38._12_4_ * auVar38._12_4_ + fVar4;
          pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
          lVar20 = lVar20 + 4;
        }
        fVar54 = 0.0;
        for (; (int)lVar20 < iVar28; lVar20 = lVar20 + 1) {
          fVar74 = *(float *)((long)pvVar11 + lVar20 * 4 + lVar23) - auVar88._0_4_;
          fVar54 = fVar74 * fVar74 + fVar54;
        }
        if (bVar19) {
          auVar107._0_4_ = auVar93._0_4_ * fVar13;
          auVar107._4_4_ = fVar51 * fVar14;
          auVar107._8_4_ = fVar52 * fVar15;
          auVar107._12_4_ = fVar100 * fVar16;
          auVar107._16_4_ = fVar113 * fVar13;
          auVar107._20_4_ = fVar114 * fVar14;
          auVar107._24_4_ = fVar115 * fVar15;
          auVar107._28_4_ = 0;
        }
        else {
          auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
        }
        auVar38 = auVar50._16_16_;
        if (bVar25) {
          auVar57._0_4_ = fVar113 + auVar93._0_4_ + auVar57._0_4_;
          auVar57._4_4_ = fVar114 + fVar51 + fVar53;
          auVar57._8_4_ = fVar115 + fVar52 + fVar3;
          auVar57._12_4_ = auVar50._28_4_ + fVar100 + fVar4;
          auVar107 = vblendps_avx(auVar107,ZEXT1632(CONCAT412(auVar57._12_4_ * fVar16,
                                                              CONCAT48(auVar57._8_4_ * fVar15,
                                                                       CONCAT44(auVar57._4_4_ *
                                                                                fVar14,auVar57._0_4_
                                                                                       * fVar13)))),
                                  0xf);
        }
        if (bVar17) {
          auVar93 = vshufpd_avx(auVar57,auVar57,1);
          auVar58._0_4_ = auVar93._0_4_ + auVar57._0_4_;
          auVar58._4_4_ = auVar93._4_4_ + auVar57._4_4_;
          auVar58._8_4_ = auVar93._8_4_ + auVar57._8_4_;
          auVar58._12_4_ = auVar93._12_4_ + auVar57._12_4_;
          auVar93 = vhaddps_avx(auVar38,auVar50._0_16_);
          auVar38 = vmovshdup_avx(auVar58);
          auVar93 = vhaddps_avx(auVar93,auVar93);
          auVar93 = vhaddps_avx(auVar93,auVar93);
          auVar107 = vblendps_avx(auVar107,ZEXT432((uint)((auVar93._0_4_ +
                                                          fVar54 + auVar38._0_4_ + auVar58._0_4_) *
                                                         fVar36)),1);
        }
        auVar50 = ZEXT1664(auVar38);
        auVar93._0_4_ = auVar107._0_4_;
        auVar104 = auVar107._0_28_;
        if (iVar5 == 1) {
          auVar93._0_4_ = auVar93._0_4_ + fVar41;
          auVar38 = vrsqrtss_avx(ZEXT416((uint)auVar93._0_4_),ZEXT416((uint)auVar93._0_4_));
          fVar41 = auVar38._0_4_;
          fVar41 = fVar41 * -0.5 * (auVar93._0_4_ * fVar41 * fVar41 + -3.0);
          auVar70 = vblendps_avx(auVar107,ZEXT432((uint)fVar41),1);
          auVar104 = auVar70._0_28_;
          auVar70 = vblendps_avx(in_ZMM12._0_32_,ZEXT432((uint)(fVar41 * -auVar88._0_4_)),1);
          in_ZMM12 = ZEXT3264(auVar70);
        }
        else if (iVar5 == 4) {
          auVar38 = vshufps_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),0);
          auVar42._0_4_ = auVar93._0_4_ + auVar38._0_4_;
          auVar42._4_4_ = auVar107._4_4_ + auVar38._4_4_;
          auVar42._8_4_ = auVar107._8_4_ + auVar38._8_4_;
          auVar42._12_4_ = auVar107._12_4_ + auVar38._12_4_;
          auVar38 = vrsqrtps_avx(auVar42);
          fVar41 = auVar38._0_4_;
          auVar93._0_4_ = auVar38._4_4_;
          fVar51 = auVar38._8_4_;
          fVar52 = auVar38._12_4_;
          fVar41 = fVar41 * -0.5 * (auVar42._0_4_ * fVar41 * fVar41 + -3.0);
          auVar93._0_4_ =
               auVar93._0_4_ * -0.5 * (auVar42._4_4_ * auVar93._0_4_ * auVar93._0_4_ + -3.0);
          fVar51 = fVar51 * -0.5 * (auVar42._8_4_ * fVar51 * fVar51 + -3.0);
          fVar52 = fVar52 * -0.5 * (auVar42._12_4_ * fVar52 * fVar52 + -3.0);
          auVar70 = vblendps_avx(auVar107,ZEXT1632(CONCAT412(fVar52,CONCAT48(fVar51,CONCAT44(auVar93
                                                  ._0_4_,fVar41)))),0xf);
          auVar104 = auVar70._0_28_;
          auVar70 = vblendps_avx(in_ZMM12._0_32_,
                                 ZEXT1632(CONCAT412(fVar52 * -in_ZMM12._12_4_,
                                                    CONCAT48(fVar51 * -in_ZMM12._8_4_,
                                                             CONCAT44(auVar93._0_4_ *
                                                                      -in_ZMM12._4_4_,
                                                                      fVar41 * -in_ZMM12._0_4_)))),
                                 0xf);
          in_ZMM12 = ZEXT3264(auVar70);
        }
        else if (iVar5 == 8) {
          auVar38 = vshufps_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),0);
          auVar46._0_4_ = auVar93._0_4_ + auVar38._0_4_;
          auVar46._4_4_ = auVar107._4_4_ + auVar38._4_4_;
          auVar46._8_4_ = auVar107._8_4_ + auVar38._8_4_;
          auVar46._12_4_ = auVar107._12_4_ + auVar38._12_4_;
          auVar46._16_4_ = auVar107._16_4_ + auVar38._0_4_;
          auVar46._20_4_ = auVar107._20_4_ + auVar38._4_4_;
          auVar46._24_4_ = auVar107._24_4_ + auVar38._8_4_;
          auVar46._28_4_ = auVar107._28_4_ + auVar38._12_4_;
          auVar70 = vrsqrtps_avx(auVar46);
          fVar41 = auVar70._0_4_;
          auVar93._0_4_ = auVar70._4_4_;
          fVar51 = auVar70._8_4_;
          fVar52 = auVar70._12_4_;
          fVar100 = auVar70._16_4_;
          fVar113 = auVar70._20_4_;
          fVar114 = auVar70._24_4_;
          auVar104._0_4_ = fVar41 * -0.5 * (auVar46._0_4_ * fVar41 * fVar41 + -3.0);
          auVar104._4_4_ =
               auVar93._0_4_ * -0.5 * (auVar46._4_4_ * auVar93._0_4_ * auVar93._0_4_ + -3.0);
          auVar104._8_4_ = fVar51 * -0.5 * (auVar46._8_4_ * fVar51 * fVar51 + -3.0);
          auVar104._12_4_ = fVar52 * -0.5 * (auVar46._12_4_ * fVar52 * fVar52 + -3.0);
          auVar104._16_4_ = fVar100 * -0.5 * (auVar46._16_4_ * fVar100 * fVar100 + -3.0);
          auVar104._20_4_ = fVar113 * -0.5 * (auVar46._20_4_ * fVar113 * fVar113 + -3.0);
          auVar104._24_4_ = fVar114 * -0.5 * (auVar46._24_4_ * fVar114 * fVar114 + -3.0);
          auVar97._0_4_ = auVar104._0_4_ * -in_ZMM12._0_4_;
          auVar97._4_4_ = auVar104._4_4_ * -in_ZMM12._4_4_;
          auVar97._8_4_ = auVar104._8_4_ * -in_ZMM12._8_4_;
          auVar97._12_4_ = auVar104._12_4_ * -in_ZMM12._12_4_;
          auVar97._16_4_ = auVar104._16_4_ * -in_ZMM12._16_4_;
          auVar97._20_4_ = auVar104._20_4_ * -in_ZMM12._20_4_;
          auVar97._28_36_ = in_ZMM12._28_36_;
          auVar97._24_4_ = auVar104._24_4_ * -in_ZMM12._24_4_;
          in_ZMM12 = ZEXT3264(auVar97._0_32_);
        }
        auVar38 = auVar104._0_16_;
        fVar41 = in_ZMM12._0_4_;
        auVar37 = in_ZMM12._0_16_;
        auVar77 = in_ZMM12._0_32_;
        auVar93._0_4_ = auVar104._0_4_;
        if (*(int *)(&this->field_0xd8 + (long)pp_Var7[-3]) == 0) {
          if (!bVar25) {
            auVar38 = vshufps_avx(auVar38,auVar38,0);
            auVar37 = vshufps_avx(auVar37,auVar37,0);
          }
          if (!bVar19) {
            auVar108._16_16_ = auVar38;
            auVar108._0_16_ = auVar38;
            auVar104 = auVar108._0_28_;
            auVar77._16_16_ = auVar37;
            auVar77._0_16_ = auVar37;
          }
          lVar20 = 0;
          iVar30 = 0;
          while (iVar30 + 8 <= iVar28) {
            auVar83._0_4_ = auVar104._0_4_ * *(float *)*pauVar32 + auVar77._0_4_;
            auVar83._4_4_ = auVar104._4_4_ * *(float *)(*pauVar32 + 4) + auVar77._4_4_;
            auVar83._8_4_ = auVar104._8_4_ * *(float *)(*pauVar32 + 8) + auVar77._8_4_;
            auVar83._12_4_ = auVar104._12_4_ * *(float *)(*pauVar32 + 0xc) + auVar77._12_4_;
            auVar83._16_4_ = auVar104._16_4_ * *(float *)(*pauVar32 + 0x10) + auVar77._16_4_;
            auVar83._20_4_ = auVar104._20_4_ * *(float *)(*pauVar32 + 0x14) + auVar77._20_4_;
            auVar83._24_4_ = auVar104._24_4_ * *(float *)(*pauVar32 + 0x18) + auVar77._24_4_;
            auVar83._28_4_ = auVar50._28_4_ + auVar77._28_4_;
            auVar50 = ZEXT3264(auVar83);
            *pauVar32 = auVar83;
            pauVar32 = pauVar32 + 1;
            lVar20 = lVar20 + 8;
            iVar30 = iVar30 + 8;
          }
          while (iVar30 = iVar30 + 4, iVar30 <= iVar28) {
            fVar51 = *(float *)(*pauVar32 + 4);
            fVar52 = *(float *)(*pauVar32 + 8);
            fVar100 = *(float *)(*pauVar32 + 0xc);
            *(float *)*pauVar32 = auVar37._0_4_ + auVar38._0_4_ * *(float *)*pauVar32;
            *(float *)(*pauVar32 + 4) = auVar37._4_4_ + auVar38._4_4_ * fVar51;
            *(float *)(*pauVar32 + 8) = auVar37._8_4_ + auVar38._8_4_ * fVar52;
            *(float *)(*pauVar32 + 0xc) = auVar37._12_4_ + auVar38._12_4_ * fVar100;
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            lVar20 = lVar20 + 4;
          }
          for (; (int)lVar20 < iVar28; lVar20 = lVar20 + 1) {
            *(float *)((long)pvVar11 + lVar20 * 4 + lVar23) =
                 fVar41 + auVar93._0_4_ * *(float *)((long)pvVar11 + lVar20 * 4 + lVar23);
          }
        }
        else {
          fVar113 = auVar104._4_4_;
          fVar114 = auVar104._8_4_;
          fVar115 = auVar104._12_4_;
          fVar51 = in_ZMM12._4_4_;
          fVar52 = in_ZMM12._8_4_;
          fVar100 = in_ZMM12._12_4_;
          pfVar21 = pfVar10;
          pfVar34 = pfVar9;
          if (bVar19) {
            for (iVar30 = 8; iVar30 <= iVar28; iVar30 = iVar30 + 8) {
              fVar53 = *pfVar34;
              fVar3 = *pfVar21;
              fVar4 = *(float *)(*pauVar32 + 4);
              fVar54 = *(float *)(*pauVar32 + 8);
              fVar74 = *(float *)(*pauVar32 + 0xc);
              fVar13 = *(float *)(*pauVar32 + 0x10);
              fVar14 = *(float *)(*pauVar32 + 0x14);
              fVar15 = *(float *)(*pauVar32 + 0x18);
              *(float *)*pauVar32 = fVar53 * (fVar41 + auVar93._0_4_ * *(float *)*pauVar32) + fVar3;
              *(float *)(*pauVar32 + 4) = fVar53 * (fVar51 + fVar113 * fVar4) + fVar3;
              *(float *)(*pauVar32 + 8) = fVar53 * (fVar52 + fVar114 * fVar54) + fVar3;
              *(float *)(*pauVar32 + 0xc) = fVar53 * (fVar100 + fVar115 * fVar74) + fVar3;
              *(float *)(*pauVar32 + 0x10) =
                   fVar53 * (in_ZMM12._16_4_ + auVar104._16_4_ * fVar13) + fVar3;
              *(float *)(*pauVar32 + 0x14) =
                   fVar53 * (in_ZMM12._20_4_ + auVar104._20_4_ * fVar14) + fVar3;
              *(float *)(*pauVar32 + 0x18) =
                   fVar53 * (in_ZMM12._24_4_ + auVar104._24_4_ * fVar15) + fVar3;
              *(float *)(*pauVar32 + 0x1c) = fVar53 + fVar3;
              pauVar32 = pauVar32 + 1;
              pfVar34 = pfVar34 + 1;
              pfVar21 = pfVar21 + 1;
            }
          }
          if (bVar25) {
            pauVar33 = pauVar32;
            for (lVar20 = 0; (int)lVar20 + 8 <= iVar28; lVar20 = lVar20 + 8) {
              fVar53 = *(float *)((long)pfVar34 + lVar20 + 4);
              fVar3 = *(float *)((long)pfVar34 + lVar20);
              fVar4 = *(float *)((long)pfVar21 + lVar20 + 4);
              fVar54 = *(float *)((long)pfVar21 + lVar20);
              auVar50 = ZEXT3264(CONCAT1616(CONCAT412(fVar4,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))),
                                            CONCAT412(fVar54,CONCAT48(fVar54,CONCAT44(fVar54,fVar54)
                                                                     ))));
              fVar74 = *(float *)(*pauVar33 + 4);
              fVar13 = *(float *)(*pauVar33 + 8);
              fVar14 = *(float *)(*pauVar33 + 0xc);
              fVar15 = *(float *)(*pauVar33 + 0x10);
              fVar16 = *(float *)(*pauVar33 + 0x14);
              fVar18 = *(float *)(*pauVar33 + 0x18);
              *(float *)*pauVar33 = fVar54 + (auVar93._0_4_ * *(float *)*pauVar33 + fVar41) * fVar3;
              *(float *)(*pauVar33 + 4) = fVar54 + (fVar113 * fVar74 + fVar51) * fVar3;
              *(float *)(*pauVar33 + 8) = fVar54 + (fVar114 * fVar13 + fVar52) * fVar3;
              *(float *)(*pauVar33 + 0xc) = fVar54 + (fVar115 * fVar14 + fVar100) * fVar3;
              *(float *)(*pauVar33 + 0x10) = fVar4 + (auVar93._0_4_ * fVar15 + fVar41) * fVar53;
              *(float *)(*pauVar33 + 0x14) = fVar4 + (fVar113 * fVar16 + fVar51) * fVar53;
              *(float *)(*pauVar33 + 0x18) = fVar4 + (fVar114 * fVar18 + fVar52) * fVar53;
              *(float *)(*pauVar33 + 0x1c) = fVar4 + fVar53;
              pauVar33 = pauVar33 + 1;
            }
            for (; (int)lVar20 + 4 <= iVar28; lVar20 = lVar20 + 4) {
              fVar53 = *(float *)((long)pfVar34 + lVar20);
              fVar3 = *(float *)((long)pfVar21 + lVar20);
              pfVar26 = (float *)(*pauVar32 + lVar20 * 4);
              fVar4 = pfVar26[1];
              fVar54 = pfVar26[2];
              fVar74 = pfVar26[3];
              pfVar31 = (float *)(*pauVar32 + lVar20 * 4);
              *pfVar31 = fVar53 * (fVar41 + auVar93._0_4_ * *pfVar26) + fVar3;
              pfVar31[1] = fVar53 * (fVar51 + fVar113 * fVar4) + fVar3;
              pfVar31[2] = fVar53 * (fVar52 + fVar114 * fVar54) + fVar3;
              pfVar31[3] = fVar53 * (fVar100 + fVar115 * fVar74) + fVar3;
              pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
            }
            pfVar21 = (float *)((long)pfVar21 + lVar20);
            pfVar34 = (float *)((long)pfVar34 + lVar20);
            pauVar32 = pauVar33;
          }
          if (bVar17) {
            auVar38 = vshufps_avx(auVar38,auVar38,0);
            auVar40 = vshufps_avx(auVar37,auVar37,0);
            lVar23 = 0;
            lVar20 = 0;
            pauVar33 = pauVar32;
            pfVar26 = pfVar21;
            pfVar31 = pfVar34;
            iVar30 = 0;
            while( true ) {
              fVar51 = auVar38._0_4_;
              fVar52 = auVar38._4_4_;
              fVar100 = auVar38._8_4_;
              if (iVar28 < iVar30 + 8) break;
              auVar82._0_4_ = (fVar51 * *(float *)*pauVar33 + auVar40._0_4_) * *pfVar31 + *pfVar26;
              auVar82._4_4_ =
                   (fVar52 * *(float *)(*pauVar33 + 4) + auVar40._4_4_) * pfVar31[1] + pfVar26[1];
              auVar82._8_4_ =
                   (fVar100 * *(float *)(*pauVar33 + 8) + auVar40._8_4_) * pfVar31[2] + pfVar26[2];
              auVar82._12_4_ =
                   (auVar38._12_4_ * *(float *)(*pauVar33 + 0xc) + auVar40._12_4_) * pfVar31[3] +
                   pfVar26[3];
              auVar82._16_4_ =
                   (fVar51 * *(float *)(*pauVar33 + 0x10) + auVar40._0_4_) * pfVar31[4] + pfVar26[4]
              ;
              auVar82._20_4_ =
                   (fVar52 * *(float *)(*pauVar33 + 0x14) + auVar40._4_4_) * pfVar31[5] + pfVar26[5]
              ;
              auVar82._24_4_ =
                   (fVar100 * *(float *)(*pauVar33 + 0x18) + auVar40._8_4_) * pfVar31[6] +
                   pfVar26[6];
              auVar82._28_4_ = auVar50._28_4_ + auVar40._12_4_ + pfVar26[7];
              auVar50 = ZEXT3264(auVar82);
              *pauVar33 = auVar82;
              pauVar33 = pauVar33 + 1;
              pfVar31 = pfVar31 + 8;
              pfVar26 = pfVar26 + 8;
              lVar20 = lVar20 + 0x20;
              lVar23 = lVar23 + 8;
              iVar30 = iVar30 + 8;
            }
            auVar37 = vshufps_avx(auVar37,auVar37,0);
            while (iVar30 = iVar30 + 4, iVar30 <= iVar28) {
              pfVar26 = (float *)(*pauVar32 + lVar20);
              fVar113 = pfVar26[1];
              fVar114 = pfVar26[2];
              fVar115 = pfVar26[3];
              pfVar31 = (float *)((long)pfVar34 + lVar20);
              fVar53 = pfVar31[1];
              fVar3 = pfVar31[2];
              fVar4 = pfVar31[3];
              pfVar1 = (float *)((long)pfVar21 + lVar20);
              fVar54 = pfVar1[1];
              fVar74 = pfVar1[2];
              fVar13 = pfVar1[3];
              pfVar2 = (float *)(*pauVar32 + lVar20);
              *pfVar2 = (fVar51 * *pfVar26 + auVar37._0_4_) * *pfVar31 + *pfVar1;
              pfVar2[1] = (fVar52 * fVar113 + auVar37._4_4_) * fVar53 + fVar54;
              pfVar2[2] = (fVar100 * fVar114 + auVar37._8_4_) * fVar3 + fVar74;
              pfVar2[3] = (auVar38._12_4_ * fVar115 + auVar37._12_4_) * fVar4 + fVar13;
              lVar20 = lVar20 + 0x10;
              lVar23 = lVar23 + 4;
            }
            for (; (int)lVar23 < iVar28; lVar23 = lVar23 + 1) {
              *(float *)(*pauVar32 + lVar23 * 4) =
                   (fVar41 + auVar93._0_4_ * *(float *)(*pauVar32 + lVar23 * 4)) * pfVar34[lVar23] +
                   pfVar21[lVar23];
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}